

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConfigData::ConfigData(ConfigData *this)

{
  this->showSuccessfulTests = false;
  this->shouldDebugBreak = false;
  this->noThrow = false;
  this->showHelp = false;
  this->listTests = false;
  this->listTags = false;
  this->listReporters = false;
  this->showSuccessfulTests = false;
  this->abortAfter = -1;
  this->verbosity = Normal;
  this->warnings = Nothing;
  (this->reporterName)._M_dataplus._M_p = (pointer)&(this->reporterName).field_2;
  (this->reporterName)._M_string_length = 0;
  (this->reporterName).field_2._M_local_buf[0] = '\0';
  (this->outputFilename)._M_dataplus._M_p = (pointer)&(this->outputFilename).field_2;
  (this->outputFilename)._M_string_length = 0;
  (this->outputFilename).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->processName)._M_dataplus._M_p = (pointer)&(this->processName).field_2;
  (this->processName)._M_string_length = 0;
  (this->processName).field_2._M_local_buf[0] = '\0';
  (this->testsOrTags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->testsOrTags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->testsOrTags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ConfigData()
        :   listTests( false ),
            listTags( false ),
            listReporters( false ),
            showSuccessfulTests( false ),
            shouldDebugBreak( false ),
            noThrow( false ),
            showHelp( false ),
            abortAfter( -1 ),
            verbosity( Verbosity::Normal ),
            warnings( WarnAbout::Nothing )
        {}